

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_csupport.cpp
# Opt level: O0

size_t ompc_get_affinity_format(char *buffer,size_t size)

{
  size_t src_size;
  char *in_RSI;
  size_t in_RDI;
  size_t format_size;
  
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  src_size = strlen(__kmp_affinity_format);
  if ((in_RDI != 0) && (in_RSI != (char *)0x0)) {
    __kmp_strncpy_truncate((char *)format_size,in_RDI,in_RSI,src_size);
  }
  return src_size;
}

Assistant:

size_t ompc_get_affinity_format(char *buffer, size_t size) {
  size_t format_size;
  if (!__kmp_init_serial) {
    __kmp_serial_initialize();
  }
  format_size = KMP_STRLEN(__kmp_affinity_format);
  if (buffer && size) {
    __kmp_strncpy_truncate(buffer, size, __kmp_affinity_format,
                           format_size + 1);
  }
  return format_size;
}